

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O2

ostream * test_detail::
          print_range<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,burst::identity_fn>
                    (ostream *stream,long *range)

{
  ostream *poVar1;
  anon_class_16_2_aa65ec36 __f;
  identity_fn local_11;
  
  std::operator<<(stream,"[");
  if ((string *)*range != (string *)range[1]) {
    std::operator<<(stream,(string *)*range);
    __f.proj = &local_11;
    __f.stream = stream;
    std::
    for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,test_detail::print_range<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,burst::identity_fn>(std::ostream&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*range + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)range[1],__f);
  }
  poVar1 = std::operator<<(stream,"]");
  return poVar1;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }